

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O3

void mkgarden(level *lev,mkroom *croom)

{
  undefined1 *puVar1;
  char cVar2;
  mkroom *pmVar3;
  xchar xVar4;
  xchar xVar5;
  rm (*parVar6) [21];
  boolean bVar7;
  schar sVar8;
  uint uVar9;
  permonst *ptr;
  monst *pmVar10;
  long lVar11;
  long lVar12;
  mkroom *croom_00;
  uint uVar13;
  int iVar14;
  coord pos;
  coord local_4a;
  monst *(*local_48) [21];
  d_level *local_40;
  rm (*local_38) [21];
  
  local_48 = lev->monsters;
  local_40 = &lev->z;
  local_38 = lev->locations;
  uVar13 = 0;
  do {
    if (croom == (mkroom *)0x0) {
      iVar14 = lev->nroom;
      uVar9 = mt_random();
      lVar11 = SUB168(ZEXT416(uVar9) % SEXT816((long)iVar14),0);
      if ((((-1 < lev->rooms[lVar11].hx) &&
           (croom_00 = lev->rooms + lVar11, croom_00->rtype == '\0')) && (croom_00->rlit != '\0'))
         && (lev->upstairs_room != croom_00)) {
        cVar2 = (lev->sstairs).sx;
        if (cVar2 == '\0') {
          pmVar3 = lev->dnstairs_room;
        }
        else {
          if ((((lev->sstairs).up != '\0') && (lev->sstairs_room == croom_00)) ||
             (lev->dnstairs_room == croom_00)) goto LAB_001e439d;
          if ((cVar2 == '\0') || ((lev->sstairs).up != '\0')) goto LAB_001e443a;
          pmVar3 = lev->sstairs_room;
        }
        if (pmVar3 != croom_00) goto LAB_001e443a;
      }
    }
    else {
      croom_00 = croom;
      if (-1 < croom->hx) {
LAB_001e443a:
        croom_00->rtype = '\x0e';
        puVar1 = &(lev->flags).field_0x8;
        *puVar1 = *puVar1 | 0x20;
        uVar13 = mt_random();
        iVar14 = uVar13 % 5 + 3;
        uVar13 = 1;
        break;
      }
    }
LAB_001e439d:
    uVar13 = uVar13 + 1;
    if (0x18 < uVar13) {
      return;
    }
  } while( true );
LAB_001e446d:
  bVar7 = somexy(lev,croom_00,&local_4a);
  xVar5 = local_4a.y;
  xVar4 = local_4a.x;
  if (bVar7 == '\0') {
LAB_001e44eb:
    uVar13 = mt_random();
    iVar14 = uVar13 % 3 + 3;
    uVar13 = 1;
    while( true ) {
      bVar7 = somexy(lev,croom_00,&local_4a);
      parVar6 = local_38;
      if (bVar7 == '\0') {
        return;
      }
      lVar12 = (long)local_4a.x;
      lVar11 = (long)local_4a.y;
      if (((local_38[lVar12][lVar11].typ == '\x19') &&
          ((local_48[lVar12][lVar11] == (monst *)0x0 ||
           ((local_48[lVar12][lVar11]->field_0x61 & 2) != 0)))) &&
         (bVar7 = nexttodoor(lev,(int)local_4a.x,(int)local_4a.y), bVar7 == '\0')) {
        uVar9 = mt_random();
        sVar8 = '\r';
        if (uVar9 * -0x55555555 < 0x55555556) {
          (lev->flags).nfountains = (lev->flags).nfountains + '\x01';
          sVar8 = '\x1c';
        }
        parVar6[lVar12][lVar11].typ = sVar8;
        iVar14 = iVar14 + -1;
      }
      if (0x31 < uVar13) break;
      uVar13 = uVar13 + 1;
      if (iVar14 < 0) {
        return;
      }
    }
    return;
  }
  if (((local_48[local_4a.x][local_4a.y] == (monst *)0x0) ||
      ((local_48[local_4a.x][local_4a.y]->field_0x61 & 2) != 0)) &&
     (ptr = mkclass(local_40,'\x0e',0), ptr != (permonst *)0x0)) {
    pmVar10 = makemon(ptr,lev,(int)xVar4,(int)xVar5,0);
    if (pmVar10 != (monst *)0x0) {
      pmVar10->field_0x62 = pmVar10->field_0x62 | 8;
    }
    iVar14 = iVar14 + -1;
  }
  if ((0x31 < uVar13) || (uVar13 = uVar13 + 1, iVar14 < 0)) goto LAB_001e44eb;
  goto LAB_001e446d;
}

Assistant:

static void mkgarden(struct level *lev, struct mkroom *croom)
{
	int tryct = 0;
	boolean maderoom = FALSE;
	coord pos;
	int i, tried;

	while ((tryct++ < 25) && !maderoom) {
	    struct mkroom *sroom = croom ? croom : &lev->rooms[rn2(lev->nroom)];

	    if (sroom->hx < 0 || (!croom &&
		    (sroom->rtype != OROOM || !sroom->rlit ||
		    has_upstairs(lev, sroom) || has_dnstairs(lev, sroom))))
		continue;

	    sroom->rtype = GARDEN;
	    maderoom = TRUE;
	    lev->flags.has_garden = 1;

	    tried = 0;
	    i = rn1(5, 3);
	    while ((tried++ < 50) && (i >= 0) && somexy(lev, sroom, &pos)) {
		const struct permonst *pmon;
		if (!MON_AT(lev, pos.x, pos.y) && (pmon = mkclass(&lev->z, S_NYMPH, 0))) {
		    struct monst *mtmp = makemon(pmon, lev, pos.x, pos.y, NO_MM_FLAGS);
		    if (mtmp) mtmp->msleeping = 1;
		    i--;
		}
	    }

	    tried = 0;
	    i = rn1(3, 3);
	    while ((tried++ < 50) && (i >= 0) && somexy(lev, sroom, &pos)) {
		if (lev->locations[pos.x][pos.y].typ == ROOM && !MON_AT(lev, pos.x, pos.y) &&
			!nexttodoor(lev, pos.x, pos.y)) {
		    if (rn2(3)) {
			lev->locations[pos.x][pos.y].typ = TREE;
		    } else {
			lev->locations[pos.x][pos.y].typ = FOUNTAIN;
			lev->flags.nfountains++;
		    }
		    i--;
		}
	    }
	}
}